

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O0

void start_pass_phuff_decoder(j_decompress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  long *in_RDI;
  bool bVar5;
  bool bVar6;
  int expected;
  int cindex;
  jpeg_component_info *compptr;
  int *prev_coef_bit_ptr;
  int *coef_bit_ptr;
  d_derived_tbl **pdtbl;
  int tbl;
  int coefi;
  int ci;
  boolean bad;
  boolean is_DC_band;
  phuff_entropy_ptr_conflict entropy;
  d_derived_tbl **in_stack_000004e0;
  int in_stack_000004e8;
  boolean in_stack_000004ec;
  j_decompress_ptr in_stack_000004f0;
  int local_60;
  int local_5c;
  int local_54;
  int local_20;
  int local_1c;
  
  lVar2 = in_RDI[0x4a];
  bVar5 = *(int *)((long)in_RDI + 0x20c) != 0;
  bVar6 = false;
  if (bVar5) {
    if (((int)in_RDI[0x42] < *(int *)((long)in_RDI + 0x20c)) || (0x3f < (int)in_RDI[0x42])) {
      bVar6 = true;
    }
    if ((int)in_RDI[0x36] != 1) {
      bVar6 = true;
    }
  }
  else {
    bVar6 = (int)in_RDI[0x42] != 0;
  }
  if ((*(int *)((long)in_RDI + 0x214) != 0) &&
     ((int)in_RDI[0x43] != *(int *)((long)in_RDI + 0x214) + -1)) {
    bVar6 = true;
  }
  if (0xd < (int)in_RDI[0x43]) {
    bVar6 = true;
  }
  if (bVar6) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x10;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x20c);
    *(int *)(*in_RDI + 0x30) = (int)in_RDI[0x42];
    *(undefined4 *)(*in_RDI + 0x34) = *(undefined4 *)((long)in_RDI + 0x214);
    *(int *)(*in_RDI + 0x38) = (int)in_RDI[0x43];
    (**(code **)*in_RDI)(in_RDI);
  }
  for (local_1c = 0; local_1c < (int)in_RDI[0x36]; local_1c = local_1c + 1) {
    iVar1 = *(int *)(in_RDI[(long)local_1c + 0x37] + 4);
    piVar3 = (int *)(in_RDI[0x18] + (long)iVar1 * 0x100);
    lVar4 = in_RDI[0x18] + (long)(iVar1 + (int)in_RDI[7]) * 0x100;
    if ((bVar5) && (*piVar3 < 0)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x73;
      *(int *)(*in_RDI + 0x2c) = iVar1;
      *(undefined4 *)(*in_RDI + 0x30) = 0;
      (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
    }
    if (*(int *)((long)in_RDI + 0x20c) < 1) {
      local_54 = *(int *)((long)in_RDI + 0x20c);
    }
    else {
      local_54 = 1;
    }
    local_20 = local_54;
    while( true ) {
      if ((int)in_RDI[0x42] < 10) {
        local_5c = 9;
      }
      else {
        local_5c = (int)in_RDI[0x42];
      }
      if (local_5c < local_20) break;
      if (*(int *)((long)in_RDI + 0xac) < 2) {
        *(undefined4 *)(lVar4 + (long)local_20 * 4) = 0;
      }
      else {
        *(int *)(lVar4 + (long)local_20 * 4) = piVar3[local_20];
      }
      local_20 = local_20 + 1;
    }
    for (local_20 = *(int *)((long)in_RDI + 0x20c); local_20 <= (int)in_RDI[0x42];
        local_20 = local_20 + 1) {
      if (piVar3[local_20] < 0) {
        local_60 = 0;
      }
      else {
        local_60 = piVar3[local_20];
      }
      if (*(int *)((long)in_RDI + 0x214) != local_60) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x73;
        *(int *)(*in_RDI + 0x2c) = iVar1;
        *(int *)(*in_RDI + 0x30) = local_20;
        (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
      }
      piVar3[local_20] = (int)in_RDI[0x43];
    }
  }
  if (*(int *)((long)in_RDI + 0x214) == 0) {
    if (bVar5) {
      *(code **)(lVar2 + 8) = decode_mcu_AC_first;
    }
    else {
      *(code **)(lVar2 + 8) = decode_mcu_DC_first;
    }
  }
  else if (bVar5) {
    *(code **)(lVar2 + 8) = decode_mcu_AC_refine;
  }
  else {
    *(code **)(lVar2 + 8) = decode_mcu_DC_refine;
  }
  for (local_1c = 0; local_1c < (int)in_RDI[0x36]; local_1c = local_1c + 1) {
    if (bVar5) {
      iVar1 = *(int *)(in_RDI[(long)local_1c + 0x37] + 0x18);
      jpeg_make_d_derived_tbl
                (in_stack_000004f0,in_stack_000004ec,in_stack_000004e8,in_stack_000004e0);
      *(undefined8 *)(lVar2 + 0x60) = *(undefined8 *)(lVar2 + 0x40 + (long)iVar1 * 8);
    }
    else if (*(int *)((long)in_RDI + 0x214) == 0) {
      jpeg_make_d_derived_tbl
                (in_stack_000004f0,in_stack_000004ec,in_stack_000004e8,in_stack_000004e0);
    }
    *(undefined4 *)(lVar2 + 0x2c + (long)local_1c * 4) = 0;
  }
  *(undefined4 *)(lVar2 + 0x20) = 0;
  *(undefined8 *)(lVar2 + 0x18) = 0;
  *(undefined4 *)(lVar2 + 0x10) = 0;
  *(undefined4 *)(lVar2 + 0x28) = 0;
  *(int *)(lVar2 + 0x3c) = (int)in_RDI[0x2e];
  return;
}

Assistant:

METHODDEF(void)
start_pass_phuff_decoder(j_decompress_ptr cinfo)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  boolean is_DC_band, bad;
  int ci, coefi, tbl;
  d_derived_tbl **pdtbl;
  int *coef_bit_ptr, *prev_coef_bit_ptr;
  jpeg_component_info *compptr;

  is_DC_band = (cinfo->Ss == 0);

  /* Validate scan parameters */
  bad = FALSE;
  if (is_DC_band) {
    if (cinfo->Se != 0)
      bad = TRUE;
  } else {
    /* need not check Ss/Se < 0 since they came from unsigned bytes */
    if (cinfo->Ss > cinfo->Se || cinfo->Se >= DCTSIZE2)
      bad = TRUE;
    /* AC scans may have only one component */
    if (cinfo->comps_in_scan != 1)
      bad = TRUE;
  }
  if (cinfo->Ah != 0) {
    /* Successive approximation refinement scan: must have Al = Ah-1. */
    if (cinfo->Al != cinfo->Ah - 1)
      bad = TRUE;
  }
  if (cinfo->Al > 13)           /* need not check for < 0 */
    bad = TRUE;
  /* Arguably the maximum Al value should be less than 13 for 8-bit precision,
   * but the spec doesn't say so, and we try to be liberal about what we
   * accept.  Note: large Al values could result in out-of-range DC
   * coefficients during early scans, leading to bizarre displays due to
   * overflows in the IDCT math.  But we won't crash.
   */
  if (bad)
    ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
             cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
  /* Update progression status, and verify that scan order is legal.
   * Note that inter-scan inconsistencies are treated as warnings
   * not fatal errors ... not clear if this is right way to behave.
   */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    int cindex = cinfo->cur_comp_info[ci]->component_index;
    coef_bit_ptr = &cinfo->coef_bits[cindex][0];
    prev_coef_bit_ptr = &cinfo->coef_bits[cindex + cinfo->num_components][0];
    if (!is_DC_band && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
      WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
    for (coefi = MIN(cinfo->Ss, 1); coefi <= MAX(cinfo->Se, 9); coefi++) {
      if (cinfo->input_scan_number > 1)
        prev_coef_bit_ptr[coefi] = coef_bit_ptr[coefi];
      else
        prev_coef_bit_ptr[coefi] = 0;
    }
    for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
      int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
      if (cinfo->Ah != expected)
        WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
      coef_bit_ptr[coefi] = cinfo->Al;
    }
  }

  /* Select MCU decoding routine */
  if (cinfo->Ah == 0) {
    if (is_DC_band)
      entropy->pub.decode_mcu = decode_mcu_DC_first;
    else
      entropy->pub.decode_mcu = decode_mcu_AC_first;
  } else {
    if (is_DC_band)
      entropy->pub.decode_mcu = decode_mcu_DC_refine;
    else
      entropy->pub.decode_mcu = decode_mcu_AC_refine;
  }

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* Make sure requested tables are present, and compute derived tables.
     * We may build same derived table more than once, but it's not expensive.
     */
    if (is_DC_band) {
      if (cinfo->Ah == 0) {     /* DC refinement needs no table */
        tbl = compptr->dc_tbl_no;
        pdtbl = (d_derived_tbl **)(entropy->derived_tbls) + tbl;
        jpeg_make_d_derived_tbl(cinfo, TRUE, tbl, pdtbl);
      }
    } else {
      tbl = compptr->ac_tbl_no;
      pdtbl = (d_derived_tbl **)(entropy->derived_tbls) + tbl;
      jpeg_make_d_derived_tbl(cinfo, FALSE, tbl, pdtbl);
      /* remember the single active table */
      entropy->ac_derived_tbl = entropy->derived_tbls[tbl];
    }
    /* Initialize DC predictions to 0 */
    entropy->saved.last_dc_val[ci] = 0;
  }

  /* Initialize bitread state variables */
  entropy->bitstate.bits_left = 0;
  entropy->bitstate.get_buffer = 0; /* unnecessary, but keeps Purify quiet */
  entropy->pub.insufficient_data = FALSE;

  /* Initialize private state variables */
  entropy->saved.EOBRUN = 0;

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}